

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall Memory::HeapBlockMap32::ResetMarks(HeapBlockMap32 *this)

{
  L2MapChunk *this_00;
  uint local_24;
  uint j;
  L2MapChunk *chunk;
  uint i;
  HeapBlockMap32 *this_local;
  
  for (chunk._4_4_ = 0; chunk._4_4_ < 0x1000; chunk._4_4_ = chunk._4_4_ + 1) {
    this_00 = this->map[chunk._4_4_];
    if (this_00 != (L2MapChunk *)0x0) {
      BVStatic<65536UL>::ClearAll(&this_00->markBits);
      this_00->isNewChunk = false;
      for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
        this_00->pageMarkCount[local_24] = 0;
      }
    }
  }
  return;
}

Assistant:

void
HeapBlockMap32::ResetMarks()
{
    for (uint i = 0; i < L1Count; i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk == nullptr)
        {
            continue;
        }

        chunk->markBits.ClearAll();

#ifdef RECYCLER_VERIFY_MARK
        chunk->isNewChunk = false;
#endif

#if DBG
        for (uint j = 0; j < L2Count; j++)
        {
            chunk->pageMarkCount[j] = 0;
        }
#endif
    }
}